

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

_Bool roaring64_bitmap_contains_bulk
                (roaring64_bitmap_t *r,roaring64_bulk_context_t *context,uint64_t val)

{
  _Bool _Var1;
  int iVar2;
  ulong *puVar3;
  uint8_t high48 [6];
  uint local_20;
  ushort local_1c;
  
  local_20 = (uint)(byte)(val >> 0x38) | ((uint)(val >> 0x20) & 0xff0000) >> 8 |
             (uint)(val >> 0x18) & 0xff0000 | (uint)(val >> 8) & 0xff000000;
  local_1c = (ushort)(val >> 0x18) & 0xff | (ushort)(val >> 8) & 0xff00;
  if ((context->leaf == (roaring64_leaf_t *)0x0) ||
     (iVar2 = art_compare_keys(context->high_bytes,(art_key_chunk_t *)&local_20), iVar2 != 0)) {
    puVar3 = art_find(&r->art,(art_key_chunk_t *)&local_20);
    if (puVar3 == (art_val_t *)0x0) {
      return false;
    }
    context->leaf = puVar3;
    *(uint *)context->high_bytes = local_20;
    *(ushort *)(context->high_bytes + 4) = local_1c;
  }
  else {
    puVar3 = context->leaf;
  }
  _Var1 = container_contains(r->containers[*puVar3 >> 8],(uint16_t)val,(uint8_t)*puVar3);
  return _Var1;
}

Assistant:

bool roaring64_bitmap_contains_bulk(const roaring64_bitmap_t *r,
                                    roaring64_bulk_context_t *context,
                                    uint64_t val) {
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);

    if (context->leaf == NULL ||
        art_compare_keys(context->high_bytes, high48) != 0) {
        // We're not positioned anywhere yet or the high bits of the key
        // differ.
        leaf_t *leaf = (leaf_t *)art_find(&r->art, high48);
        if (leaf == NULL) {
            return false;
        }
        context->leaf = leaf;
        memcpy(context->high_bytes, high48, ART_KEY_BYTES);
    }
    return container_contains(get_container(r, *context->leaf), low16,
                              get_typecode(*context->leaf));
}